

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

bool CLIntercept::Create(void *pGlobalData,CLIntercept **pIntercept)

{
  int iVar1;
  CLIntercept *this;
  
  this = (CLIntercept *)operator_new(0x9f58);
  CLIntercept(this,pGlobalData);
  *pIntercept = this;
  iVar1 = init(this,(EVP_PKEY_CTX *)pGlobalData);
  if (SUB41(iVar1,0) == false) {
    Delete(pIntercept);
  }
  return SUB41(iVar1,0);
}

Assistant:

bool CLIntercept::Create( void* pGlobalData, CLIntercept*& pIntercept )
{
    bool    success = false;

    pIntercept = new CLIntercept( pGlobalData );
    if( pIntercept )
    {
        success = pIntercept->init();
        if( success == false )
        {
            Delete( pIntercept );
        }
    }

    return success;
}